

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_export.c
# Opt level: O3

REF_STATUS ref_export_tec_ed3_zone(REF_GRID ref_grid,FILE *file)

{
  REF_NODE pRVar1;
  REF_CELL ref_cell;
  REF_DBL *pRVar2;
  uint uVar3;
  REF_STATUS RVar4;
  long lVar5;
  undefined8 uVar6;
  int cell;
  char *pcVar7;
  REF_INT cell_00;
  long lVar8;
  uint cell_id;
  REF_INT nnode;
  REF_INT *g2l;
  REF_INT nedge;
  REF_DICT ref_dict;
  REF_INT *l2g;
  REF_INT nodes [27];
  uint local_dc;
  REF_INT *local_d8;
  int local_cc;
  REF_DICT local_c8;
  REF_INT *local_c0;
  REF_GRID local_b8;
  long local_b0;
  uint local_a8 [30];
  
  pRVar1 = ref_grid->node;
  uVar3 = ref_dict_create(&local_c8);
  if (uVar3 == 0) {
    ref_cell = ref_grid->cell[2];
    local_b8 = ref_grid;
    if (0 < ref_cell->max) {
      cell = 0;
      do {
        RVar4 = ref_cell_nodes(ref_cell,cell,(REF_INT *)local_a8);
        if ((RVar4 == 0) &&
           (uVar3 = ref_dict_store(local_c8,local_a8[ref_cell->node_per],-1), uVar3 != 0)) {
          pcVar7 = "mark tri";
          uVar6 = 0x163;
          goto LAB_001dbf6a;
        }
        cell = cell + 1;
      } while (cell < ref_cell->max);
    }
    if (local_c8->n < 1) {
LAB_001dbf17:
      uVar3 = ref_dict_free(local_c8);
      if (uVar3 == 0) {
        return 0;
      }
      pcVar7 = "free dict";
      uVar6 = 0x182;
    }
    else {
      cell_id = *local_c8->key;
      uVar3 = ref_grid_cell_id_nodes
                        (local_b8,ref_cell,cell_id,(REF_INT *)&local_dc,&local_cc,&local_d8,
                         &local_c0);
      if (uVar3 == 0) {
        local_b0 = 0;
        do {
          fprintf((FILE *)file,
                  "zone t=\"p3edge%d\", nodes=%d, elements=%d, datapacking=%s, zonetype=%s\n",
                  (ulong)cell_id,(ulong)local_dc,(ulong)(uint)(local_cc * 3),"point","felineseg");
          if (0 < (int)local_dc) {
            lVar8 = 0;
            do {
              pRVar2 = pRVar1->real;
              lVar5 = (long)local_c0[lVar8];
              fprintf((FILE *)file," %.16e %.16e %.16e\n",pRVar2[lVar5 * 0xf],
                      pRVar2[lVar5 * 0xf + 1],pRVar2[lVar5 * 0xf + 2]);
              lVar8 = lVar8 + 1;
            } while (lVar8 < (int)local_dc);
          }
          if (0 < ref_cell->max) {
            cell_00 = 0;
            do {
              RVar4 = ref_cell_nodes(ref_cell,cell_00,(REF_INT *)local_a8);
              if ((RVar4 == 0) && (cell_id == local_a8[ref_cell->node_per])) {
                fprintf((FILE *)file," %d %d\n",(ulong)(local_d8[(int)local_a8[0]] + 1),
                        (ulong)(local_d8[(int)local_a8[2]] + 1));
                fprintf((FILE *)file," %d %d\n",(ulong)(local_d8[(int)local_a8[2]] + 1),
                        (ulong)(local_d8[(int)local_a8[3]] + 1));
                fprintf((FILE *)file," %d %d\n",(ulong)(local_d8[(int)local_a8[3]] + 1),
                        (ulong)(local_d8[(int)local_a8[1]] + 1));
              }
              cell_00 = cell_00 + 1;
            } while (cell_00 < ref_cell->max);
          }
          if (local_c0 != (REF_INT *)0x0) {
            free(local_c0);
          }
          if (local_d8 != (REF_INT *)0x0) {
            free(local_d8);
          }
          lVar8 = local_b0 + 1;
          if (local_c8->n <= lVar8) goto LAB_001dbf17;
          cell_id = local_c8->key[lVar8];
          local_b0 = lVar8;
          uVar3 = ref_grid_cell_id_nodes
                            (local_b8,ref_cell,cell_id,(REF_INT *)&local_dc,&local_cc,&local_d8,
                             &local_c0);
        } while (uVar3 == 0);
      }
      pcVar7 = "extract this edge";
      uVar6 = 0x169;
    }
  }
  else {
    pcVar7 = "create dict";
    uVar6 = 0x15e;
  }
LAB_001dbf6a:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",uVar6,
         "ref_export_tec_ed3_zone",(ulong)uVar3,pcVar7);
  return uVar3;
}

Assistant:

REF_FCN static REF_STATUS ref_export_tec_ed3_zone(REF_GRID ref_grid,
                                                  FILE *file) {
  REF_NODE ref_node;
  REF_CELL ref_cell;
  REF_INT node;
  REF_INT *g2l, *l2g;
  REF_INT nedge;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT cell;
  REF_INT nnode;
  REF_DICT ref_dict;
  REF_INT boundary_tag, boundary_index;

  ref_node = ref_grid_node(ref_grid);

  RSS(ref_dict_create(&ref_dict), "create dict");

  ref_cell = ref_grid_ed3(ref_grid);
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    RSS(ref_dict_store(ref_dict, nodes[ref_cell_id_index(ref_cell)], REF_EMPTY),
        "mark tri");
  }

  each_ref_dict_key(ref_dict, boundary_index, boundary_tag) {
    RSS(ref_grid_cell_id_nodes(ref_grid, ref_cell, boundary_tag, &nnode, &nedge,
                               &g2l, &l2g),
        "extract this edge");

    fprintf(file,
            "zone t=\"p3edge%d\", nodes=%d, elements=%d, datapacking=%s, "
            "zonetype=%s\n",
            boundary_tag, nnode, 3 * nedge, "point", "felineseg");

    for (node = 0; node < nnode; node++)
      fprintf(file, " %.16e %.16e %.16e\n",
              ref_node_xyz(ref_node, 0, l2g[node]),
              ref_node_xyz(ref_node, 1, l2g[node]),
              ref_node_xyz(ref_node, 2, l2g[node]));

    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      if (boundary_tag == nodes[ref_cell_id_index(ref_cell)]) {
        fprintf(file, " %d %d\n", g2l[nodes[0]] + 1, g2l[nodes[2]] + 1);
        fprintf(file, " %d %d\n", g2l[nodes[2]] + 1, g2l[nodes[3]] + 1);
        fprintf(file, " %d %d\n", g2l[nodes[3]] + 1, g2l[nodes[1]] + 1);
      }
    }

    ref_free(l2g);
    ref_free(g2l);
  }

  RSS(ref_dict_free(ref_dict), "free dict");

  return REF_SUCCESS;
}